

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

void Llb_MnxStop(Llb_Mnx_t *p)

{
  void **ppvVar1;
  int *piVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  int level;
  DdManager *dd;
  double dVar5;
  double dVar6;
  
  if (p->pPars->fVerbose != 0) {
    dd = p->dd;
    lVar3 = Cudd_ReadReorderingTime(dd);
    p->timeReo = lVar3;
    p->timeOther = p->timeTotal - (p->timeImage + p->timeRemap);
    level = (int)dd;
    Abc_Print(level,"%s =","Image    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeImage * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeImage / 1000000.0,dVar5);
    Abc_Print(level,"%s =","Remap    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeRemap * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeRemap / 1000000.0,dVar5);
    Abc_Print(level,"%s =","Other    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar5);
    Abc_Print(level,"%s =","TOTAL    ");
    dVar6 = (double)p->timeTotal;
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = (dVar6 * 100.0) / dVar6;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar6 / 1000000.0,dVar5);
    Abc_Print(level,"%s =","  reo    ");
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = ((double)p->timeReo * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeReo / 1000000.0,dVar5);
  }
  if (p->bBad != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bBad);
  }
  if (p->bReached != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bReached);
  }
  if (p->bCurrent != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bCurrent);
  }
  if (p->bNext != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bNext);
  }
  if ((p->vRings != (Vec_Ptr_t *)0x0) && (pVVar4 = p->vRings, 0 < pVVar4->nSize)) {
    lVar3 = 0;
    do {
      Cudd_RecursiveDeref(p->dd,(DdNode *)pVVar4->pArray[lVar3]);
      lVar3 = lVar3 + 1;
      pVVar4 = p->vRings;
    } while (lVar3 < pVVar4->nSize);
  }
  if ((p->vRoots != (Vec_Ptr_t *)0x0) && (pVVar4 = p->vRoots, 0 < pVVar4->nSize)) {
    lVar3 = 0;
    do {
      Cudd_RecursiveDeref(p->dd,(DdNode *)pVVar4->pArray[lVar3]);
      lVar3 = lVar3 + 1;
      pVVar4 = p->vRoots;
    } while (lVar3 < pVVar4->nSize);
  }
  if (p->vRings != (Vec_Ptr_t *)0x0) {
    ppvVar1 = p->vRings->pArray;
    if (ppvVar1 != (void **)0x0) {
      free(ppvVar1);
      p->vRings->pArray = (void **)0x0;
    }
    if (p->vRings != (Vec_Ptr_t *)0x0) {
      free(p->vRings);
      p->vRings = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vRoots != (Vec_Ptr_t *)0x0) {
    ppvVar1 = p->vRoots->pArray;
    if (ppvVar1 != (void **)0x0) {
      free(ppvVar1);
      p->vRoots->pArray = (void **)0x0;
    }
    if (p->vRoots != (Vec_Ptr_t *)0x0) {
      free(p->vRoots);
      p->vRoots = (Vec_Ptr_t *)0x0;
    }
  }
  Extra_StopManager(p->dd);
  if (p->vOrder != (Vec_Int_t *)0x0) {
    piVar2 = p->vOrder->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vOrder->pArray = (int *)0x0;
    }
    if (p->vOrder != (Vec_Int_t *)0x0) {
      free(p->vOrder);
      p->vOrder = (Vec_Int_t *)0x0;
    }
  }
  if (p->vVars2Q != (Vec_Int_t *)0x0) {
    piVar2 = p->vVars2Q->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vVars2Q->pArray = (int *)0x0;
    }
    if (p->vVars2Q != (Vec_Int_t *)0x0) {
      free(p->vVars2Q);
      p->vVars2Q = (Vec_Int_t *)0x0;
    }
  }
  if (p != (Llb_Mnx_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Llb_MnxStop( Llb_Mnx_t * p )
{
    DdNode * bTemp;
    int i;
    if ( p->pPars->fVerbose ) 
    {
        p->timeReo = Cudd_ReadReorderingTime(p->dd);
        p->timeOther = p->timeTotal - p->timeImage - p->timeRemap;
        ABC_PRTP( "Image    ", p->timeImage, p->timeTotal );
        ABC_PRTP( "Remap    ", p->timeRemap, p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal, p->timeTotal );
        ABC_PRTP( "  reo    ", p->timeReo,   p->timeTotal );
    }
    // remove BDDs
    if ( p->bBad )
        Cudd_RecursiveDeref( p->dd, p->bBad );
    if ( p->bReached )
        Cudd_RecursiveDeref( p->dd, p->bReached );
    if ( p->bCurrent )
        Cudd_RecursiveDeref( p->dd, p->bCurrent );
    if ( p->bNext )
        Cudd_RecursiveDeref( p->dd, p->bNext );
	if ( p->vRings )
    Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
        Cudd_RecursiveDeref( p->dd, bTemp );
	if ( p->vRoots )
    Vec_PtrForEachEntry( DdNode *, p->vRoots, bTemp, i )
        Cudd_RecursiveDeref( p->dd, bTemp );
    // remove arrays
    Vec_PtrFreeP( &p->vRings );
    Vec_PtrFreeP( &p->vRoots );
//Cudd_PrintInfo( p->dd, stdout );
    Extra_StopManager( p->dd );
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vVars2Q );
    ABC_FREE( p );
}